

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_diag_sse2_128_64.c
# Opt level: O1

parasail_result_t *
parasail_sg_flags_diag_sse2_128_64
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  int *piVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined4 uVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  int iVar7;
  parasail_result_t *ppVar8;
  int64_t *ptr;
  int64_t *ptr_00;
  int64_t *ptr_01;
  int64_t *ptr_02;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  long lVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  __m128i_64_t B_2;
  long lVar29;
  __m128i_64_t A_1;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  __m128i_64_t B_3;
  long lVar32;
  long lVar35;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  long lVar36;
  __m128i_64_t A;
  int64_t iVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  long lVar40;
  __m128i_64_t B_1;
  long lVar42;
  undefined1 auVar41 [16];
  __m128i_64_t B;
  long lVar45;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 local_1a8 [16];
  long local_168;
  long lStack_160;
  long lStack_150;
  long local_138;
  long lStack_130;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined8 local_108;
  long lStack_100;
  undefined8 local_f8;
  long lStack_f0;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  ulong local_a8;
  long local_a0;
  int *local_98;
  long local_90;
  long local_88;
  ulong local_80;
  undefined1 local_78 [16];
  long local_68;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  int local_48;
  undefined4 uStack_44;
  int iStack_40;
  undefined4 uStack_3c;
  int64_t iVar15;
  
  if (_s2 == (char *)0x0) {
    parasail_sg_flags_diag_sse2_128_64_cold_7();
    return (parasail_result_t *)0x0;
  }
  uVar23 = (ulong)(uint)s2Len;
  if (s2Len < 1) {
    parasail_sg_flags_diag_sse2_128_64_cold_6();
    return (parasail_result_t *)0x0;
  }
  if (open < 0) {
    parasail_sg_flags_diag_sse2_128_64_cold_5();
    return (parasail_result_t *)0x0;
  }
  if (gap < 0) {
    parasail_sg_flags_diag_sse2_128_64_cold_4();
    return (parasail_result_t *)0x0;
  }
  if (matrix == (parasail_matrix_t *)0x0) {
    parasail_sg_flags_diag_sse2_128_64_cold_3();
    return (parasail_result_t *)0x0;
  }
  if (matrix->type == 0) {
    if (_s1 == (char *)0x0) {
      parasail_sg_flags_diag_sse2_128_64_cold_2();
      return (parasail_result_t *)0x0;
    }
    if (_s1Len < 1) {
      parasail_sg_flags_diag_sse2_128_64_cold_1();
      return (parasail_result_t *)0x0;
    }
  }
  else {
    _s1Len = matrix->length;
  }
  local_108._0_4_ = _s1Len + 1;
  iVar12 = matrix->min;
  iVar19 = -open;
  local_f8._4_4_ = 0;
  uVar9 = 0x8000000000000000 - (long)iVar12;
  if (iVar12 != iVar19 && SBORROW4(iVar12,iVar19) == iVar12 + open < 0) {
    uVar9 = (ulong)(uint)open | 0x8000000000000000;
  }
  lVar10 = uVar9 + 1;
  lVar22 = 0x7ffffffffffffffe - (long)matrix->max;
  auVar24._8_4_ = (int)lVar10;
  auVar24._0_8_ = lVar10;
  auVar24._12_4_ = (int)((ulong)lVar10 >> 0x20);
  uVar20 = (ulong)_s1Len;
  local_88 = uVar20 - 1;
  local_78 = (undefined1  [16])0x0;
  local_128 = (undefined1  [16])0x0;
  if (s1_beg == 0) {
    local_78._4_4_ = 0;
    local_78._0_4_ = gap * 2;
    local_78._8_4_ = gap * 2;
    local_78._12_4_ = 0;
  }
  lStack_150 = auVar24._8_8_;
  local_b8._8_8_ = lStack_150;
  local_b8._0_8_ = lVar10;
  local_c8._8_8_ = lStack_150;
  local_c8._0_8_ = lVar10;
  local_d8._8_8_ = lStack_150;
  local_d8._0_8_ = lVar10;
  local_118._8_8_ = lStack_150;
  local_118._0_8_ = lVar10;
  local_e8._8_8_ = lStack_150;
  local_e8._0_8_ = lVar10;
  if (s1_beg == 0) {
    local_128._8_8_ = (long)iVar19;
    local_128._0_8_ = (long)(iVar19 - gap);
  }
  local_f8._0_4_ = open;
  ppVar8 = parasail_result_new();
  if (ppVar8 == (parasail_result_t *)0x0) {
    return (parasail_result_t *)0x0;
  }
  ppVar8->flag = (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar8->flag | 0x2801002;
  uVar13 = (ulong)(s2Len + 2);
  local_a8 = uVar9;
  ptr = parasail_memalign_int64_t(0x10,uVar13);
  ptr_00 = parasail_memalign_int64_t(0x10,uVar13);
  ptr_01 = parasail_memalign_int64_t(0x10,uVar13);
  if (ptr_01 == (int64_t *)0x0 || (ptr_00 == (int64_t *)0x0 || ptr == (int64_t *)0x0)) {
    return (parasail_result_t *)0x0;
  }
  if (matrix->type == 0) {
    ptr_02 = parasail_memalign_int64_t(0x10,(long)(int)local_108);
    if (ptr_02 == (int64_t *)0x0) {
      return (parasail_result_t *)0x0;
    }
    if (0 < _s1Len) {
      piVar1 = matrix->mapper;
      uVar9 = 0;
      do {
        ptr_02[uVar9] = (long)piVar1[(byte)_s1[uVar9]];
        uVar9 = uVar9 + 1;
      } while (uVar20 != uVar9);
    }
    ptr_02[uVar20] = 0;
  }
  else {
    ptr_02 = (int64_t *)0x0;
  }
  uVar4 = local_f8._4_4_;
  iVar12 = (int)local_f8;
  lVar21 = CONCAT44(local_108._4_4_,(int)local_108);
  lVar16 = CONCAT44(local_f8._4_4_,(int)local_f8);
  local_48 = (int)local_f8;
  uStack_44 = local_f8._4_4_;
  iStack_40 = (int)local_f8;
  uStack_3c = local_f8._4_4_;
  local_58._0_8_ = CONCAT44(0,gap);
  local_58._8_4_ = gap;
  local_58._12_4_ = 0;
  auVar5 = local_58;
  piVar1 = matrix->mapper;
  uVar9 = 1;
  if (1 < s2Len) {
    uVar9 = uVar23;
  }
  uVar13 = 0;
  do {
    ptr[uVar13 + 1] = (long)piVar1[(byte)_s2[uVar13]];
    uVar13 = uVar13 + 1;
  } while (uVar9 != uVar13);
  *ptr = 0;
  ptr[uVar23 + 1] = 0;
  local_90 = (long)iVar19;
  if (s2_beg == 0) {
    uVar9 = 1;
    if (1 < s2Len) {
      uVar9 = uVar23;
    }
    uVar13 = 0;
    lVar14 = local_90;
    do {
      ptr_00[uVar13 + 1] = lVar14;
      ptr_01[uVar13 + 1] = lVar10;
      uVar13 = uVar13 + 1;
      lVar14 = lVar14 - (ulong)(uint)gap;
    } while (uVar9 != uVar13);
  }
  else {
    uVar13 = 0;
    do {
      ptr_00[uVar13 + 1] = 0;
      ptr_01[uVar13 + 1] = lVar10;
      uVar13 = uVar13 + 1;
    } while (uVar9 != uVar13);
  }
  *ptr_00 = lVar10;
  *ptr_01 = lVar10;
  ptr_00[uVar23 + 1] = lVar10;
  ptr_01[uVar23 + 1] = lVar10;
  *ptr_00 = 0;
  local_138 = lVar10;
  local_168 = lVar22;
  lStack_160 = lVar22;
  if (_s1Len < 1) {
    lStack_130 = lStack_150;
  }
  else {
    local_98 = matrix->matrix;
    local_a0 = (long)matrix->size;
    iVar7 = matrix->type;
    local_68 = lStack_150;
    uStack_60 = 0;
    local_1a8 = ZEXT416(1);
    local_80 = 0;
    lStack_130 = lStack_150;
    do {
      uVar9 = local_80;
      if (iVar7 == 0) {
        uVar9 = ptr_02[local_80];
      }
      uVar6 = (uint)local_80;
      if (iVar7 == 0) {
        iVar15 = ptr_02[local_80 | 1];
      }
      else {
        uVar11 = uVar6 | 1;
        if (uVar20 <= (local_80 | 1)) {
          uVar11 = _s1Len - 1;
        }
        iVar15 = (int64_t)(int)uVar11;
      }
      lVar16 = -(ulong)((long)local_1a8._0_8_ < (long)uVar20);
      lVar21 = -(ulong)(local_1a8._0_8_ == local_88);
      local_80 = local_80 + 2;
      iVar18 = iVar19 - uVar6 * gap;
      iVar37 = *ptr_00;
      *ptr_00 = local_90 - local_80 * (uint)gap;
      local_f8._0_4_ = (int)lVar16;
      local_f8._4_4_ = (undefined4)((ulong)lVar16 >> 0x20);
      lStack_f0 = -(ulong)((long)local_1a8._8_8_ < (long)uVar20);
      local_108._0_4_ = (int)lVar21;
      local_108._4_4_ = (undefined4)((ulong)lVar21 >> 0x20);
      lStack_100 = -(ulong)(local_1a8._8_8_ == local_88);
      if (s1_beg != 0) {
        iVar18 = 0;
      }
      auVar41._8_8_ = (long)iVar18;
      auVar41._0_8_ = lStack_150;
      uVar13 = 0;
      auVar39 = ZEXT816(0xffffffffffffffff);
      auVar38 = auVar24;
      auVar44 = auVar24;
      lVar14 = lStack_150;
      do {
        lVar36 = auVar41._8_8_;
        lVar17 = ptr_00[uVar13 + 1];
        lVar40 = CONCAT44(uVar4,iVar12);
        lVar42 = CONCAT44(uVar4,iVar12);
        lVar32 = lVar36 - lVar40;
        lVar35 = lVar17 - lVar42;
        local_58._12_4_ = 0;
        lVar29 = auVar38._8_8_ - local_58._0_8_;
        if (lVar29 < lVar32) {
          lVar29 = lVar32;
        }
        lVar32 = ptr_01[uVar13 + 1] - local_58._8_8_;
        if (ptr_01[uVar13 + 1] - local_58._8_8_ < lVar35) {
          lVar32 = lVar35;
        }
        lVar40 = auVar41._0_8_ - lVar40;
        lVar42 = lVar36 - lVar42;
        lVar35 = auVar44._0_8_ - local_58._0_8_;
        lVar45 = auVar44._8_8_ - local_58._8_8_;
        if (lVar35 < lVar40) {
          lVar35 = lVar40;
        }
        if (lVar45 < lVar42) {
          lVar45 = lVar42;
        }
        lVar40 = lVar35;
        if (lVar35 < local_98[iVar15 * local_a0 + ptr[uVar13]] + lVar14) {
          lVar40 = local_98[iVar15 * local_a0 + ptr[uVar13]] + lVar14;
        }
        lVar14 = lVar45;
        if (lVar45 < local_98[uVar9 * local_a0 + ptr[uVar13 + 1]] + iVar37) {
          lVar14 = local_98[uVar9 * local_a0 + ptr[uVar13 + 1]] + iVar37;
        }
        if (lVar40 <= lVar29) {
          lVar40 = lVar29;
        }
        auVar38._8_8_ = lVar32;
        auVar38._0_8_ = lVar29;
        if (lVar14 <= lVar32) {
          lVar14 = lVar32;
        }
        auVar44._8_8_ = lVar45;
        auVar44._0_8_ = lVar35;
        auVar33._8_8_ = lVar14;
        auVar33._0_8_ = lVar40;
        lVar42 = auVar39._0_8_;
        lVar32 = auVar39._8_8_;
        auVar43._8_8_ = -(ulong)(lVar32 == -1);
        auVar43._0_8_ = -(ulong)(lVar42 == -1);
        auVar41 = auVar43 & local_128 | ~auVar43 & auVar33;
        auVar38 = ~auVar43 & auVar38 | auVar43 & auVar24;
        lVar40 = auVar41._0_8_;
        lVar29 = auVar41._8_8_;
        lVar14 = lStack_130;
        if (1 < uVar13) {
          if (lVar40 <= local_168) {
            local_168 = lVar40;
          }
          if (lVar29 <= lStack_160) {
            lStack_160 = lVar29;
          }
          if (local_138 <= lVar40) {
            local_138 = lVar40;
          }
          lVar14 = lVar29;
          if (lVar29 < lStack_130) {
            lVar14 = lStack_130;
          }
        }
        lStack_130 = lVar14;
        auVar44 = ~auVar43 & auVar44 | auVar43 & auVar24;
        auVar34._8_8_ = -(ulong)(lVar32 == uVar23 - 1);
        auVar34._0_8_ = -(ulong)(lVar42 == uVar23 - 1);
        auVar25._0_4_ = (int)(auVar39._4_4_ ^ 0xffffffff) >> 0x1f;
        auVar25._4_4_ = (int)(auVar39._4_4_ ^ 0xffffffff) >> 0x1f;
        auVar25._8_4_ = (int)(auVar39._12_4_ ^ 0xffffffff) >> 0x1f;
        auVar25._12_4_ = (int)(auVar39._12_4_ ^ 0xffffffff) >> 0x1f;
        auVar30._8_8_ = -(ulong)(lVar32 < (long)uVar23);
        auVar30._0_8_ = -(ulong)(lVar42 < (long)uVar23);
        auVar31._8_8_ = -(ulong)(local_b8._8_8_ < lVar29);
        auVar31._0_8_ = -(ulong)(local_b8._0_8_ < lVar40);
        auVar26._8_8_ = -(ulong)(local_c8._8_8_ < lVar29);
        auVar26._0_8_ = -(ulong)(local_c8._0_8_ < lVar40);
        auVar2._8_8_ = -(ulong)(local_1a8._8_8_ == local_88);
        auVar2._0_8_ = lVar21;
        auVar31 = auVar30 & auVar25 & auVar2 & auVar31;
        auVar3._8_8_ = -(ulong)((long)local_1a8._8_8_ < (long)uVar20);
        auVar3._0_8_ = lVar16;
        auVar26 = auVar3 & auVar34 & auVar26;
        local_b8 = auVar31 & auVar41 | ~auVar31 & local_b8;
        local_c8 = auVar26 & auVar41 | ~auVar26 & local_c8;
        local_d8 = ~(auVar34 & auVar2) & local_d8 | auVar41 & auVar34 & auVar2;
        local_118 = auVar26 & local_1a8 | ~auVar26 & local_118;
        local_e8 = auVar31 & auVar39 | ~auVar31 & local_e8;
        ptr_00[uVar13] = lVar40;
        ptr_01[uVar13] = auVar38._0_8_;
        auVar39._0_8_ = lVar42 + 1;
        auVar39._8_8_ = lVar32 + 1;
        uVar13 = uVar13 + 1;
        lVar14 = lVar36;
        iVar37 = lVar17;
      } while (s2Len + 1 != uVar13);
      local_1a8._8_8_ = local_1a8._8_8_ + 2;
      local_1a8._0_8_ = local_1a8._0_8_ + 2;
      local_128._8_8_ = local_128._8_8_ - local_78._8_8_;
      local_128._0_8_ = local_128._0_8_ - local_78._0_8_;
    } while (local_80 < uVar20);
  }
  lVar40 = 0;
  iVar12 = 0;
  iVar19 = 0;
  lVar17 = lVar10;
  lVar14 = lVar10;
  do {
    lVar42 = *(long *)(local_c8 + lVar40 * 8);
    if ((lVar10 < lVar42) ||
       ((lVar42 == lVar10 && (*(long *)(local_118 + lVar40 * 8) < (long)iVar12)))) {
      iVar12 = *(int *)(local_118 + lVar40 * 8);
      lVar10 = lVar42;
    }
    if (lVar17 < *(long *)(local_b8 + lVar40 * 8)) {
      iVar19 = *(int *)(local_e8 + lVar40 * 8);
      lVar17 = *(long *)(local_b8 + lVar40 * 8);
    }
    if (lVar14 < *(long *)(local_d8 + lVar40 * 8)) {
      lVar14 = *(long *)(local_d8 + lVar40 * 8);
    }
    lVar40 = lVar40 + 1;
  } while ((int)lVar40 == 1);
  if (s1_end == 0 || s2_end == 0) {
    if (s1_end == 0) {
      iVar12 = _s1Len + -1;
      iVar7 = s2Len + -1;
      if (s2_end != 0) {
        lVar14 = lVar17;
        iVar7 = iVar19;
      }
      goto LAB_005677d3;
    }
  }
  else if ((lVar10 <= lVar17) && ((lVar10 != lVar17 || (iVar19 != s2Len + -1)))) {
    iVar12 = _s1Len + -1;
    lVar14 = lVar17;
    iVar7 = iVar19;
    goto LAB_005677d3;
  }
  lVar14 = lVar10;
  iVar7 = s2Len + -1;
LAB_005677d3:
  iVar19 = (int)lVar14;
  auVar27._8_8_ = -(ulong)(lStack_160 <= (long)local_a8);
  auVar27._0_8_ = -(ulong)(local_168 <= (long)local_a8);
  auVar28._8_8_ = -(ulong)(lVar22 < lStack_130);
  auVar28._0_8_ = -(ulong)(lVar22 < local_138);
  auVar28 = auVar28 | auVar27;
  if ((((((((((((((((auVar28 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar28 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar28 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar28 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar28 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar28 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar28 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar28 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar28 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar28 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar28 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar28 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar28 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
       (auVar28 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar28 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar28[0xf] < '\0') {
    *(byte *)&ppVar8->flag = (byte)ppVar8->flag | 0x40;
    iVar19 = 0;
    iVar7 = 0;
    iVar12 = 0;
  }
  ppVar8->score = iVar19;
  ppVar8->end_query = iVar12;
  ppVar8->end_ref = iVar7;
  local_58 = auVar5;
  local_108 = lVar21;
  local_f8 = lVar16;
  parasail_free(ptr_01);
  parasail_free(ptr_00);
  parasail_free(ptr);
  if (matrix->type == 0) {
    parasail_free(ptr_02);
    return ppVar8;
  }
  return ppVar8;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int64_t * restrict s1 = NULL;
    int64_t * restrict s2B = NULL;
    int64_t * restrict _H_pr = NULL;
    int64_t * restrict _F_pr = NULL;
    int64_t * restrict s2 = NULL;
    int64_t * restrict H_pr = NULL;
    int64_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxHRow;
    __m128i vMaxHCol;
    __m128i vLastVal;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 2; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vOpen = _mm_set1_epi64x_rpl(open);
    vGap  = _mm_set1_epi64x_rpl(gap);
    vOne = _mm_set1_epi64x_rpl(1);
    vN = _mm_set1_epi64x_rpl(N);
    vGapN = s1_beg ? _mm_set1_epi64x_rpl(0) : _mm_set1_epi64x_rpl(gap*N);
    vNegOne = _mm_set1_epi64x_rpl(-1);
    vI = _mm_set_epi64x_rpl(0,1);
    vJreset = _mm_set_epi64x_rpl(0,-1);
    vMaxHRow = vNegInf;
    vMaxHCol = vNegInf;
    vLastVal = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi64x_rpl(s1Len);
    vILimit1 = _mm_sub_epi64(vILimit, vOne);
    vJLimit = _mm_set1_epi64x_rpl(s2Len);
    vJLimit1 = _mm_sub_epi64(vJLimit, vOne);
    vIBoundary = s1_beg ? _mm_set1_epi64x_rpl(0) : _mm_set_epi64x_rpl(
            -open-0*gap,
            -open-1*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int64_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int64_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    if (s2_beg) {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = 0;
            F_pr[j] = NEG_LIMIT;
        }
    }
    else {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = -open - j*gap;
            F_pr[j] = NEG_LIMIT;
        }
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf;
        __m128i vWH = vNegInf;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        __m128i vIltLimit = _mm_cmplt_epi64_rpl(vI, vILimit);
        __m128i vIeqLimit1 = _mm_cmpeq_epi64_rpl(vI, vILimit1);
        vNH = _mm_srli_si128(vNH, 8);
        vNH = _mm_insert_epi64_rpl(vNH, H_pr[-1], 1);
        vWH = _mm_srli_si128(vWH, 8);
        vWH = _mm_insert_epi64_rpl(vWH, s1_beg ? 0 : (-open - i*gap), 1);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 8);
            vNH = _mm_insert_epi64_rpl(vNH, H_pr[j], 1);
            vF = _mm_srli_si128(vF, 8);
            vF = _mm_insert_epi64_rpl(vF, F_pr[j], 1);
            vF = _mm_max_epi64_rpl(
                    _mm_sub_epi64(vNH, vOpen),
                    _mm_sub_epi64(vF, vGap));
            vE = _mm_max_epi64_rpl(
                    _mm_sub_epi64(vWH, vOpen),
                    _mm_sub_epi64(vE, vGap));
            vMat = _mm_set_epi64x_rpl(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]]
                    );
            vNWH = _mm_add_epi64(vNWH, vMat);
            vWH = _mm_max_epi64_rpl(vNWH, vE);
            vWH = _mm_max_epi64_rpl(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi64_rpl(vJ,vNegOne);
                vWH = _mm_blendv_epi8_rpl(vWH, vIBoundary, cond);
                vF = _mm_blendv_epi8_rpl(vF, vNegInf, cond);
                vE = _mm_blendv_epi8_rpl(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWH,0);
            F_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vF,0);
            /* as minor diagonal vector passes across the i or j limit
             * boundary, extract the last value of the column or row */
            {
                __m128i vJeqLimit1 = _mm_cmpeq_epi64_rpl(vJ, vJLimit1);
                __m128i vJgtNegOne = _mm_cmpgt_epi64_rpl(vJ, vNegOne);
                __m128i vJltLimit = _mm_cmplt_epi64_rpl(vJ, vJLimit);
                __m128i cond_j = _mm_and_si128(vIltLimit, vJeqLimit1);
                __m128i cond_i = _mm_and_si128(vIeqLimit1,
                        _mm_and_si128(vJgtNegOne, vJltLimit));
                __m128i cond_max_row = _mm_cmpgt_epi64_rpl(vWH, vMaxHRow);
                __m128i cond_max_col = _mm_cmpgt_epi64_rpl(vWH, vMaxHCol);
                __m128i cond_last_val = _mm_and_si128(vIeqLimit1, vJeqLimit1);
                __m128i cond_all_row = _mm_and_si128(cond_max_row, cond_i);
                __m128i cond_all_col = _mm_and_si128(cond_max_col, cond_j);
                vMaxHRow = _mm_blendv_epi8_rpl(vMaxHRow, vWH, cond_all_row);
                vMaxHCol = _mm_blendv_epi8_rpl(vMaxHCol, vWH, cond_all_col);
                vLastVal = _mm_blendv_epi8_rpl(vLastVal, vWH, cond_last_val);
                vEndI = _mm_blendv_epi8_rpl(vEndI, vI, cond_all_col);
                vEndJ = _mm_blendv_epi8_rpl(vEndJ, vJ, cond_all_row);
            }
            vJ = _mm_add_epi64(vJ, vOne);
        }
        vI = _mm_add_epi64(vI, vN);
        vIBoundary = _mm_sub_epi64(vIBoundary, vGapN);
    }

    /* alignment ending position */
    {
        int64_t max_row = NEG_LIMIT;
        int64_t max_col = NEG_LIMIT;
        int64_t last_val = NEG_LIMIT;
        int64_t *s = (int64_t*)&vMaxHRow;
        int64_t *t = (int64_t*)&vMaxHCol;
        int64_t *u = (int64_t*)&vLastVal;
        int64_t *i = (int64_t*)&vEndI;
        int64_t *j = (int64_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++s, ++t, ++u, ++i, ++j) {
            if (*t > max_col || (*t == max_col && *i < end_query)) {
                max_col = *t;
                end_query = *i;
            }
            if (*s > max_row) {
                max_row = *s;
                end_ref = *j;
            }
            if (*u > last_val) {
                last_val = *u;
            }
        }
        if (s1_end && s2_end) {
            if (max_col > max_row || (max_col == max_row && end_ref == s2Len-1)) {
                score = max_col;
                end_ref = s2Len-1;
            }
            else {
                score = max_row;
                end_query = s1Len-1;
            }
        }
        else if (s1_end) {
            score = max_col;
            end_ref = s2Len-1;
        }
        else if (s2_end) {
            score = max_row;
            end_query = s1Len-1;
        }
        else {
            score = last_val;
            end_query = s1Len-1;
            end_ref = s2Len-1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}